

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O3

void gc_finalize(lua_State *L)

{
  uint uVar1;
  TValue *pTVar2;
  cTValue *mo;
  GCtab *mt;
  GCobj *o;
  global_State *g;
  TValue tmp;
  TValue local_20;
  
  g = (global_State *)(ulong)(L->glref).ptr32;
  uVar1 = (g->gc).mmudata.gcptr32;
  local_20.field_2.field_0 =
       (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)*(uint *)(ulong)uVar1;
  o = (GCobj *)(ulong)local_20.u32.lo;
  if (local_20.u32.lo == uVar1) {
    (g->gc).mmudata.gcptr32 = 0;
  }
  else {
    *(uint *)(ulong)uVar1 = (o->gch).nextgc.gcptr32;
  }
  if ((o->gch).gct == '\n') {
    (o->gch).nextgc.gcptr32 = (g->gc).root.gcptr32;
    (g->gc).root.gcptr32 = (uint32_t)local_20.field_2.field_0;
    (o->gch).marked = (g->gc).currentwhite & 3 | (o->gch).marked & 0xe8;
    local_20.field_2.it = 0xfffffff5;
    pTVar2 = lj_tab_set(L,(GCtab *)(ulong)g->gcroot[0x26].gcptr32,&local_20);
    if ((pTVar2->field_2).it != 0xffffffff) {
      (g->gc).nocdatafin = '\0';
      local_20.field_2 = *(anon_struct_8_2_fd66bcdd_for_TValue_2 *)pTVar2;
      (pTVar2->field_2).it = 0xffffffff;
      gc_call_finalizer(g,L,&local_20,o);
    }
  }
  else {
    *(undefined4 *)o = *(undefined4 *)(ulong)(g->mainthref).gcptr32;
    *(undefined4 *)(ulong)(g->mainthref).gcptr32 = local_20.field_2.field_0;
    (o->gch).marked = (g->gc).currentwhite & 3 | (o->gch).marked & 0xf8;
    mt = (GCtab *)(ulong)(o->gch).metatable.gcptr32;
    if ((mt != (GCtab *)0x0) && ((mt->nomm & 4) == 0)) {
      mo = lj_meta_cache(mt,MM_gc,(GCstr *)(ulong)g->gcroot[2].gcptr32);
      if (mo != (cTValue *)0x0) {
        gc_call_finalizer(g,L,mo,o);
        return;
      }
    }
  }
  return;
}

Assistant:

static void gc_finalize(lua_State *L)
{
  global_State *g = G(L);
  GCobj *o = gcnext(gcref(g->gc.mmudata));
  cTValue *mo;
  lj_assertG(tvref(g->jit_base) == NULL, "finalizer called on trace");
  /* Unchain from list of userdata to be finalized. */
  if (o == gcref(g->gc.mmudata))
    setgcrefnull(g->gc.mmudata);
  else
    setgcrefr(gcref(g->gc.mmudata)->gch.nextgc, o->gch.nextgc);
#if LJ_HASFFI
  if (o->gch.gct == ~LJ_TCDATA) {
    TValue tmp, *tv;
    /* Add cdata back to the GC list and make it white. */
    setgcrefr(o->gch.nextgc, g->gc.root);
    setgcref(g->gc.root, o);
    makewhite(g, o);
    o->gch.marked &= (uint8_t)~LJ_GC_CDATA_FIN;
    /* Resolve finalizer. */
    setcdataV(L, &tmp, gco2cd(o));
    tv = lj_tab_set(L, tabref(g->gcroot[GCROOT_FFI_FIN]), &tmp);
    if (!tvisnil(tv)) {
      g->gc.nocdatafin = 0;
      copyTV(L, &tmp, tv);
      setnilV(tv);  /* Clear entry in finalizer table. */
      gc_call_finalizer(g, L, &tmp, o);
    }
    return;
  }
#endif
  /* Add userdata back to the main userdata list and make it white. */
  setgcrefr(o->gch.nextgc, mainthread(g)->nextgc);
  setgcref(mainthread(g)->nextgc, o);
  makewhite(g, o);
  /* Resolve the __gc metamethod. */
  mo = lj_meta_fastg(g, tabref(gco2ud(o)->metatable), MM_gc);
  if (mo)
    gc_call_finalizer(g, L, mo, o);
}